

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall
jpge::jpeg_encoder::load_quantized_coefficients(jpeg_encoder *this,int component_num)

{
  int iVar1;
  int local_2c;
  sample_array_t j;
  int i;
  int16 *pDst;
  int32 *q;
  int component_num_local;
  jpeg_encoder *this_local;
  
  pDst = (int16 *)(this->m_quantization_tables + (0 < component_num));
  _j = this->m_coefficient_array;
  for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
    iVar1 = this->m_sample_array[(byte)s_zag[local_2c]];
    if (iVar1 < 0) {
      iVar1 = (*(int *)pDst >> 1) - iVar1;
      if (iVar1 < *(int *)pDst) {
        *_j = 0;
      }
      else {
        *_j = -(short)(iVar1 / *(int *)pDst);
      }
    }
    else {
      iVar1 = iVar1 + (*(int *)pDst >> 1);
      if (iVar1 < *(int *)pDst) {
        *_j = 0;
      }
      else {
        *_j = (short)(iVar1 / *(int *)pDst);
      }
    }
    _j = _j + 1;
    pDst = pDst + 2;
  }
  return;
}

Assistant:

void jpeg_encoder::load_quantized_coefficients(int component_num)
{
  int32 *q = m_quantization_tables[component_num > 0];
  int16 *pDst = m_coefficient_array;
  for (int i = 0; i < 64; i++)
  {
    sample_array_t j = m_sample_array[s_zag[i]];
    if (j < 0)
    {
      if ((j = -j + (*q >> 1)) < *q)
        *pDst++ = 0;
      else
        *pDst++ = static_cast<int16>(-(j / *q));
    }
    else
    {
      if ((j = j + (*q >> 1)) < *q)
        *pDst++ = 0;
      else
        *pDst++ = static_cast<int16>((j / *q));
    }
    q++;
  }
}